

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup
          (ComputationGraph *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  LookupNode *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  LookupNode *local_30;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(p->dim).d - (long)(p->super_ParametersBase)._vptr_ParametersBase) >>
            3);
  this_00 = (LookupNode *)operator_new(0xa8);
  LookupNode::LookupNode(this_00,(LookupParameters *)indices,in_RCX);
  local_30 = this_00;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,(Node **)&local_30);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::push_back
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)((p->dim).d + 4),
             (value_type *)this);
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, const std::vector<unsigned>& indices) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, indices);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}